

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseCodeTree.cpp
# Opt level: O2

bool __thiscall
Indexing::ClauseCodeTree::removeOneOfAlternatives
          (ClauseCodeTree *this,CodeOp *op,Clause *cl,
          Stack<Indexing::CodeTree::CodeOp_*> *firstsInBlocks)

{
  CodeOp **ppCVar1;
  CodeOp **ppCVar2;
  ulong uVar3;
  bool bVar4;
  
  ppCVar1 = firstsInBlocks->_cursor;
  ppCVar2 = firstsInBlocks->_stack;
  while( true ) {
    uVar3 = op->_content;
    bVar4 = ((Clause *)(uVar3 >> 3) == cl && (uVar3 & 7) == 0) && uVar3 != 0;
    if (bVar4) {
      op->_content = 0;
      CodeTree::optimizeMemoryAfterRemoval(&this->super_CodeTree,firstsInBlocks,op);
      return bVar4;
    }
    op = op->_alternative;
    if (op == (CodeOp *)0x0) break;
    Lib::Stack<Indexing::CodeTree::CodeOp_*>::push(firstsInBlocks,op);
  }
  firstsInBlocks->_cursor =
       firstsInBlocks->_stack + ((ulong)((long)ppCVar1 - (long)ppCVar2) >> 3 & 0xffffffff);
  return bVar4;
}

Assistant:

bool ClauseCodeTree::removeOneOfAlternatives(CodeOp* op, Clause* cl, Stack<CodeOp*>* firstsInBlocks)
{
  unsigned initDepth=firstsInBlocks->size();

  while(!op->isSuccess() || op->getSuccessResult<Clause>()!=cl) {
    op=op->alternative();
    if(!op) {
      firstsInBlocks->truncate(initDepth);
      return false;
    }
    firstsInBlocks->push(op);
  }
  op->makeFail();
  optimizeMemoryAfterRemoval(firstsInBlocks, op);
  return true;
}